

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O3

VectorU __thiscall anurbs::HilbertCurve<2L>::point_at(HilbertCurve<2L> *this,size_t m,size_t h)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  VectorU *p;
  ulong i;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  VectorU VVar12;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (-1 < (long)(m - 1)) {
    lVar5 = *(long *)this;
    lVar10 = *(long *)(this + 8);
    lVar9 = m * 2 + -1;
    uVar4 = 0;
    uVar11 = 0;
    do {
      uVar8 = (int)(h >> ((byte)lVar9 & 0x3f)) * 2 & 2;
      i = (ulong)((h >> ((ulong)((int)lVar9 - 1U & 0xff) & 0x3f) & 1) != 0) | (ulong)uVar8;
      uVar6 = 0;
      if (i != 0) {
        uVar6 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
      }
      m = m - 1;
      bVar1 = (byte)uVar11 ^ 1;
      bVar3 = 2 - bVar1;
      uVar7 = (((int)uVar4 << (bVar3 & 0x1f) | (uint)(uVar4 >> bVar1)) & 3 ^ uVar8 >> 1) ^ i;
      uVar8 = (uint)(uVar7 << (bVar3 & 0x3f)) & 3 | (uint)(uVar7 >> bVar1);
      lVar5 = lVar5 + ((ulong)(uVar8 & 1) << ((byte)m & 0x3f));
      lVar10 = lVar10 + ((ulong)(uVar8 >> 1 & 1) << ((byte)m & 0x3f));
      uVar4 = uVar4 ^ ((uint)(uVar6 >> (bVar3 & 0x3f)) | (uint)(uVar6 << bVar1)) & 3;
      sVar2 = d(i);
      uVar11 = ~(uVar11 + (int)sVar2) & 1;
      lVar9 = lVar9 + -2;
    } while (0 < (long)m);
    *(long *)this = lVar5;
    *(long *)(this + 8) = lVar10;
  }
  VVar12.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [1] = h;
  VVar12.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [0] = (unsigned_long)this;
  return (VectorU)VVar12.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.
                  m_storage.m_data.array;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }